

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O2

void __thiscall rw::PluginList::streamSkip(PluginList *this,Stream *stream)

{
  bool bVar1;
  int32 length;
  ChunkHeaderInfo header;
  
  bVar1 = findChunk(stream,3,(uint32 *)&length,(uint32 *)0x0);
  if ((bVar1) && (0 < length)) {
    do {
      bVar1 = readChunkHeaderInfo(stream,&header);
      if (!bVar1) {
        return;
      }
      (*stream->_vptr_Stream[5])(stream,(ulong)header.length,1);
      length = (length - header.length) + -0xc;
    } while (0 < length);
  }
  return;
}

Assistant:

void
PluginList::streamSkip(Stream *stream)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return;
		stream->seek(header.length);
		length -= 12 + header.length;
	}
}